

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TaggedUnionExpressionSyntax *pTVar1;
  DeepCloneVisitor visitor;
  SyntaxNode *local_38;
  Token local_30;
  Token local_20;
  
  local_20 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x38) == (SyntaxNode *)0x0) {
    local_38 = (SyntaxNode *)0x0;
  }
  else {
    local_38 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_38,
                          (BumpAllocator *)__child_stack);
  }
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TaggedUnionExpressionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*>
                     ((BumpAllocator *)__child_stack,&local_20,&local_30,
                      (ExpressionSyntax **)&local_38);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TaggedUnionExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TaggedUnionExpressionSyntax>(
        node.tagged.deepClone(alloc),
        node.member.deepClone(alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr
    );
}